

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall c4::yml::Tree::doc(Tree *this,size_t i)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  NodeData *pNVar4;
  
  sVar3 = root_id(this);
  pNVar4 = _p(this,sVar3);
  if ((~(int)(pNVar4->m_type).type & 0x28U) != 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar2 = is_debugger_attached();
      if (bVar2) {
        pcVar1 = (code *)swi(3);
        sVar3 = (*pcVar1)();
        return sVar3;
      }
    }
    to_csubstr(
              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
              );
    (*(code *)PTR_error_impl_0028c7d8)
              ("check failed: is_stream(rid)",0x1c,(anonymous_namespace)::s_default_callbacks);
  }
  sVar3 = child(this,sVar3,i);
  return sVar3;
}

Assistant:

size_t doc(size_t i) const { size_t rid = root_id(); RYML_ASSERT(is_stream(rid)); return child(rid, i); }